

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O2

void Aig_ManPackSetRandom(Aig_ManPack_t *p)

{
  Vec_Ptr_t *p_00;
  uint uVar1;
  uint uVar2;
  int i;
  int i_00;
  
  for (i_00 = 0; p_00 = p->pAig->vCis, i_00 < p_00->nSize; i_00 = i_00 + 1) {
    Vec_PtrEntry(p_00,i_00);
    uVar1 = Aig_ManRandom(0);
    uVar2 = Aig_ManRandom(0);
    Vec_WrdWriteEntry(p->vPiPats,i_00,((ulong)uVar1 << 0x21) + (ulong)uVar2 * 2);
  }
  return;
}

Assistant:

void Aig_ManPackSetRandom( Aig_ManPack_t * p )
{
    Aig_Obj_t * pObj;
    word Sign;
    int i;
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        Sign = (((word)Aig_ManRandom(0)) << 32) | ((word)Aig_ManRandom(0));
        Vec_WrdWriteEntry( p->vPiPats, i, Sign << 1 );
    }
}